

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkUnrollAndDrop(Abc_Ntk_t *p,int nFrames,int nFramesAdd,Vec_Int_t *vFlops,int *piPivot)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p_00;
  void *pvVar5;
  long *plVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  if (nFramesAdd < 0) {
    __assert_fail("nFramesAdd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                  ,0x126,
                  "Abc_Ntk_t *Abc_NtkUnrollAndDrop(Abc_Ntk_t *, int, int, Vec_Int_t *, int *)");
  }
  if (p->ntkType == ABC_NTK_LOGIC) {
    if (vFlops->nSize == p->nObjCounts[8]) {
      *piPivot = -1;
      pNtk = Abc_NtkAlloc(p->ntkType,p->ntkFunc,1);
      pcVar2 = Extra_UtilStrsav(p->pName);
      pNtk->pName = pcVar2;
      for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
        pAVar3 = Abc_NtkCi(p,iVar7);
        pAVar4 = Abc_NtkCreatePi(pNtk);
        (pAVar3->field_6).pCopy = pAVar4;
      }
      p_00 = Abc_NtkDfs(p,0);
      for (iVar7 = 0; iVar7 <= nFrames + nFramesAdd; iVar7 = iVar7 + 1) {
        if (iVar7 != 0) {
          for (iVar8 = 0; iVar8 < p->vPis->nSize; iVar8 = iVar8 + 1) {
            pvVar5 = Vec_PtrEntry(p->vPis,iVar8);
            pAVar3 = Abc_NtkCreatePi(pNtk);
            *(Abc_Obj_t **)((long)pvVar5 + 0x40) = pAVar3;
          }
        }
        for (iVar8 = 0; iVar8 < p_00->nSize; iVar8 = iVar8 + 1) {
          pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar8);
          Abc_NtkDupObj(pNtk,pAVar3,0);
          for (lVar9 = 0; lVar9 < (pAVar3->vFanins).nSize; lVar9 = lVar9 + 1) {
            Abc_ObjAddFanin((pAVar3->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar9]] +
                             0x40));
          }
        }
        for (iVar8 = 0; iVar8 < p->vCos->nSize; iVar8 = iVar8 + 1) {
          pAVar3 = Abc_NtkCo(p,iVar8);
          pAVar3->field_6 =
               *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)
                ((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x40);
        }
        for (iVar8 = 0; iVar8 < p->vPos->nSize; iVar8 = iVar8 + 1) {
          pvVar5 = Vec_PtrEntry(p->vPos,iVar8);
          pAVar3 = Abc_NtkCreatePo(pNtk);
          Abc_ObjAddFanin(pAVar3,*(Abc_Obj_t **)((long)pvVar5 + 0x40));
        }
        if (iVar7 == 0) {
          *piPivot = pNtk->nObjs;
        }
        for (iVar8 = 0; iVar8 < p->vBoxes->nSize; iVar8 = iVar8 + 1) {
          plVar6 = (long *)Vec_PtrEntry(p->vBoxes,iVar8);
          if ((*(uint *)((long)plVar6 + 0x14) & 0xf) == 8) {
            lVar9 = *(long *)(*(long *)(*plVar6 + 0x20) + 8);
            *(undefined8 *)(*(long *)(lVar9 + (long)*(int *)plVar6[6] * 8) + 0x40) =
                 *(undefined8 *)(*(long *)(lVar9 + (long)*(int *)plVar6[4] * 8) + 0x40);
          }
        }
        if (nFramesAdd < iVar7) {
          for (iVar8 = 0; iVar8 < vFlops->nSize; iVar8 = iVar8 + 1) {
            iVar1 = Vec_IntEntry(vFlops,iVar8);
            if (iVar1 != 0) {
              pAVar3 = Abc_NtkCo(p,p->vPos->nSize + iVar8);
              pAVar4 = Abc_NtkCreatePo(pNtk);
              Abc_ObjAddFanin(pAVar4,(pAVar3->field_6).pCopy);
            }
          }
        }
      }
      Vec_PtrFree(p_00);
      Abc_NtkAddDummyPiNames(pNtk);
      Abc_NtkAddDummyPoNames(pNtk);
      Abc_NtkCleanup(pNtk,0);
      iVar7 = Abc_NtkCheck(pNtk);
      if (iVar7 == 0) {
        fwrite("Abc_NtkCreateFromNode(): Network check has failed.\n",0x33,1,_stdout);
      }
      return pNtk;
    }
    __assert_fail("Vec_IntSize(vFlops) == Abc_NtkLatchNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                  ,0x128,
                  "Abc_Ntk_t *Abc_NtkUnrollAndDrop(Abc_Ntk_t *, int, int, Vec_Int_t *, int *)");
  }
  __assert_fail("Abc_NtkIsLogic(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                ,0x127,"Abc_Ntk_t *Abc_NtkUnrollAndDrop(Abc_Ntk_t *, int, int, Vec_Int_t *, int *)")
  ;
}

Assistant:

Abc_Ntk_t * Abc_NtkUnrollAndDrop( Abc_Ntk_t * p, int nFrames, int nFramesAdd, Vec_Int_t * vFlops, int * piPivot )
{
    Abc_Ntk_t * pNtk; 
    Abc_Obj_t * pFanin, * pNode;
    Vec_Ptr_t * vNodes;
    int i, k, f, Value;
    assert( nFramesAdd >= 0 );
    assert( Abc_NtkIsLogic(p) );
    assert( Vec_IntSize(vFlops) == Abc_NtkLatchNum(p) );
    *piPivot = -1;
    // start the network
    pNtk = Abc_NtkAlloc( p->ntkType, p->ntkFunc, 1 );
    pNtk->pName = Extra_UtilStrsav(Abc_NtkName(p));
    // add CIs for the new network
    Abc_NtkForEachCi( p, pNode, i )
        pNode->pCopy = Abc_NtkCreatePi( pNtk );
    // iterate unrolling
    vNodes = Abc_NtkDfs( p, 0 );
    for ( f = 0; f <= nFrames + nFramesAdd; f++ )
    {
        if ( f > 0 )
        {
            Abc_NtkForEachPi( p, pNode, i )
                pNode->pCopy = Abc_NtkCreatePi( pNtk );
        }
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            Abc_NtkDupObj( pNtk, pNode, 0 );
            Abc_ObjForEachFanin( pNode, pFanin, k )
                Abc_ObjAddFanin( pNode->pCopy, pFanin->pCopy );
        }
        Abc_NtkForEachCo( p, pNode, i )
            pNode->pCopy = Abc_ObjFanin0(pNode)->pCopy;
        Abc_NtkForEachPo( p, pNode, i )
            Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pNode->pCopy );
        // add buffers
        if ( f == 0 )
        {
            *piPivot = Abc_NtkObjNum(pNtk);
//            Abc_NtkForEachLatchInput( p, pNode, i )
//                pNode->pCopy = Abc_NtkCreateNodeBuf( pNtk, pNode->pCopy );
        }
        // transfer to flop outputs
        Abc_NtkForEachLatch( p, pNode, i )
            Abc_ObjFanout0(pNode)->pCopy = Abc_ObjFanin0(pNode)->pCopy;
        // add final POs
        if ( f > nFramesAdd )
        {
            Vec_IntForEachEntry( vFlops, Value, i )
            {
                if ( Value == 0 )
                    continue;
                pNode = Abc_NtkCo( p, Abc_NtkPoNum(p) + i );
                Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pNode->pCopy );
            }
        }
    }
    Vec_PtrFree( vNodes );
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    // perform combinational cleanup
    Abc_NtkCleanup( pNtk, 0 );
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkCreateFromNode(): Network check has failed.\n" );
    return pNtk;
}